

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

long __thiscall tetgenmesh::lawsonflip3d(tetgenmesh *this,flipconstraints *fc)

{
  badface **fstack;
  badface *pbVar1;
  memorypool *pmVar2;
  tetrahedron ppdVar3;
  tetrahedron pd;
  double *pdVar4;
  long lVar5;
  char *pcVar6;
  arraypool *paVar7;
  uint uVar8;
  ulong uVar9;
  tetrahedron *pppdVar10;
  long lVar11;
  ulong uVar12;
  triface *flipface;
  ulong uVar13;
  long lVar14;
  int *piVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  triface fliptets [5];
  long lStack_c0;
  int aiStack_b8 [2];
  ulong local_b0;
  triface local_a8;
  triface local_98;
  tetrahedron *local_88;
  uint local_80;
  tetrahedron *local_78;
  uint local_70;
  tetrahedron *local_68;
  int local_60;
  flipconstraints *local_58;
  long local_50;
  long local_48;
  double local_40;
  double local_38;
  
  lVar5 = 8;
  do {
    *(undefined8 *)((long)&local_b0 + lVar5) = 0;
    *(undefined4 *)((long)&local_a8.tet + lVar5) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x58);
  fstack = &this->flipstack;
  iVar17 = 0;
  lVar5 = 0;
  local_50 = 0;
  local_58 = fc;
  do {
    if (2 < this->b->verbose) {
      lStack_c0 = 0x14626f;
      printf("      Lawson flip %ld faces.\n");
    }
    uVar13 = 0;
    pbVar1 = *fstack;
    lVar14 = lVar5;
    lVar19 = local_48;
    while (local_48 = lVar14, pbVar1 != (badface *)0x0) {
      local_a8.tet = (pbVar1->tt).tet;
      local_a8.ver = (pbVar1->tt).ver;
      this->flipstack = pbVar1->nextitem;
      pmVar2 = this->flippool;
      (pbVar1->tt).tet = (tetrahedron *)pmVar2->deaditemstack;
      pmVar2->deaditemstack = pbVar1;
      pmVar2->items = pmVar2->items + -1;
      if ((local_a8.tet != (tetrahedron *)0x0) && (local_a8.tet[4] != (tetrahedron)0x0)) {
        uVar8 = *(uint *)((long)local_a8.tet + (long)this->elemmarkerindex * 4);
        uVar16 = 4 << ((byte)local_a8.ver & 3);
        if ((uVar8 & uVar16) != 0) {
          *(uint *)((long)local_a8.tet + (long)this->elemmarkerindex * 4) = uVar8 & ~uVar16;
          ppdVar3 = (tetrahedron)this->dummypoint;
          if (local_a8.tet[7] != ppdVar3) {
            uVar8 = local_a8.ver & 3;
            local_98.tet = (tetrahedron *)((ulong)local_a8.tet[uVar8] & 0xfffffffffffffff0);
            local_98.ver = fsymtbl[local_a8.ver][(uint)local_a8.tet[uVar8] & 0xf];
            local_b0 = uVar13;
            if (local_98.tet[7] == ppdVar3) {
              if (this->nonconvex != 0) {
                if (local_a8.tet[9] == (tetrahedron)0x0) {
                  uVar12 = 0;
                }
                else {
                  pdVar4 = local_a8.tet[9][uVar8];
                  uVar12 = (ulong)pdVar4 & 0xfffffffffffffff8;
                  iVar17 = tspivottbl[local_a8.ver][(uint)pdVar4 & 7];
                }
                iVar18 = 3;
                do {
                  if (*(long *)(uVar12 + 0x30 + (long)(iVar17 >> 1) * 8) == 0) {
                    uVar9 = *(ulong *)(uVar12 + (long)(iVar17 >> 1) * 8);
                    uVar16 = (uint)uVar9 & 7;
                    uVar9 = uVar9 & 0xfffffffffffffff8;
                    uVar16 = *(long *)(uVar12 + (long)sorgpivot[iVar17] * 8) !=
                             *(long *)(uVar9 + (long)sdestpivot[uVar16] * 8) ^ uVar16;
                    uVar9 = *(ulong *)(uVar9 + 0x48 + (ulong)(uVar16 & 1) * 8);
                    uVar8 = (uint)uVar9 & 0xf;
                    pppdVar10 = (tetrahedron *)(uVar9 & 0xfffffffffffffff0);
                    if (pppdVar10 != (tetrahedron *)0x0) {
                      uVar8 = stpivottbl[uVar8][uVar16];
                    }
                    if (local_a8.tet == pppdVar10) {
                      if (*(tetrahedron *)
                           (((ulong)pppdVar10[edestoppotbl[(int)uVar8] & 3] & 0xfffffffffffffff0) +
                           (long)oppopivot[fsymtbl[edestoppotbl[(int)uVar8]]
                                           [(uint)pppdVar10[edestoppotbl[(int)uVar8] & 3] & 0xf]] *
                           8) == ppdVar3) {
                        piVar15 = orgpivot;
                      }
                      else {
                        if (*(tetrahedron *)
                             (((ulong)pppdVar10[eorgoppotbl[(int)uVar8] & 3] & 0xfffffffffffffff0) +
                             (long)oppopivot[fsymtbl[eorgoppotbl[(int)uVar8]]
                                             [(uint)pppdVar10[eorgoppotbl[(int)uVar8] & 3] & 0xf]] *
                             8) != ppdVar3) {
                          local_98.tet = (tetrahedron *)
                                         ((ulong)pppdVar10[facepivot1[(int)uVar8]] &
                                         0xfffffffffffffff0);
                          local_98.ver = facepivot2[(int)uVar8]
                                         [(uint)pppdVar10[facepivot1[(int)uVar8]] & 0xf];
                          local_88 = (tetrahedron *)
                                     ((ulong)local_98.tet[facepivot1[local_98.ver]] &
                                     0xfffffffffffffff0);
                          local_80 = facepivot2[local_98.ver]
                                     [(uint)local_98.tet[facepivot1[local_98.ver]] & 0xf];
                          lStack_c0 = 0x146915;
                          local_a8.tet = pppdVar10;
                          local_a8.ver = uVar8;
                          flip32(this,&local_a8,1,fc);
                          this->flip32count = this->flip32count + -1;
                          this->flip22count = this->flip22count + -1;
                          local_50 = local_50 + 1;
                          uVar13 = local_b0;
                          if (fc->remove_ndelaunay_edge != 0) {
                            this->tetprism_vol_sum = fc->tetprism_vol_sum + this->tetprism_vol_sum;
                            fc->tetprism_vol_sum = 0.0;
                          }
                          break;
                        }
                        piVar15 = destpivot;
                      }
                      if ((*(uint *)((long)pppdVar10[piVar15[(int)uVar8]] +
                                    (long)this->pointmarkindex * 4 + 4) & 0xfffffe00) == 0x600) {
                        lStack_c0 = 0x146ae9;
                        removevertexbyflips(this,(point)pppdVar10[piVar15[(int)uVar8]]);
                        uVar13 = local_b0;
                      }
                      break;
                    }
                  }
                  iVar17 = snextpivot[iVar17];
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
            }
            else if (((this->checksubfaceflag == 0) || (local_a8.tet[9] == (tetrahedron)0x0)) ||
                    (local_a8.tet[9][uVar8] == (double *)0x0)) {
              lStack_c0 = 0x146395;
              dVar20 = insphere_s(this,(double *)local_98.tet[4],(double *)local_98.tet[5],
                                  (double *)local_98.tet[6],(double *)local_98.tet[7],
                                  (double *)local_a8.tet[oppopivot[local_a8.ver]]);
              uVar13 = local_b0;
              if (dVar20 < 0.0) {
                ppdVar3 = local_a8.tet[oppopivot[local_a8.ver]];
                pd = local_98.tet[oppopivot[local_98.ver]];
                dVar20 = ((double)pd[2] - (double)ppdVar3[2]) * ((double)pd[2] - (double)ppdVar3[2])
                         + ((double)*pd - (double)*ppdVar3) * ((double)*pd - (double)*ppdVar3) +
                           ((double)pd[1] - (double)ppdVar3[1]) *
                           ((double)pd[1] - (double)ppdVar3[1]);
                if (dVar20 < 0.0) {
                  lStack_c0 = 0x146448;
                  dVar20 = sqrt(dVar20);
                }
                else {
                  dVar20 = SQRT(dVar20);
                }
                local_40 = dVar20 * dVar20 * dVar20;
                iVar18 = 3;
                do {
                  lStack_c0 = 0x146493;
                  dVar20 = orient3d((double *)local_a8.tet[orgpivot[local_a8.ver]],
                                    (double *)local_a8.tet[destpivot[local_a8.ver]],
                                    (double *)ppdVar3,(double *)pd);
                  if (0.0 < dVar20) {
                    local_88 = local_a8.tet;
                    lVar5 = (long)local_a8.ver;
                    piVar15 = esymtbl;
                    local_80 = esymtbl[lVar5];
                    local_78 = local_98.tet;
                    local_70 = esymtbl[local_98.ver];
                    if (((local_a8.tet[9] != (tetrahedron)0x0) &&
                        (piVar15 = (int *)(ulong)(esymtbl[lVar5] & 3),
                        local_a8.tet[9][(long)piVar15] != (double *)0x0)) ||
                       ((local_98.tet[9] != (tetrahedron)0x0 &&
                        (local_98.tet[9][local_70 & 3] != (double *)0x0)))) {
                      lStack_c0 = 0x146534;
                      local_38 = dVar20;
                      dVar21 = orient3dfast((tetgenmesh *)piVar15,
                                            (double *)local_a8.tet[orgpivot[lVar5]],
                                            (double *)local_a8.tet[destpivot[lVar5]],
                                            (double *)ppdVar3,(double *)pd);
                      dVar20 = local_38;
                      if (ABS(dVar21) / local_40 < this->b->epsilon) {
                        dVar20 = 0.0;
                      }
                    }
                  }
                  lVar5 = local_48;
                  fc = local_58;
                  if (dVar20 <= 0.0) break;
                  local_a8.ver = enexttbl[local_a8.ver];
                  local_98.ver = eprevtbl[local_98.ver];
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
                if (0.0 < dVar20) {
                  lStack_c0 = 0x1465b7;
                  flip23(this,&local_a8,0,local_58);
                  iVar18 = fc->remove_ndelaunay_edge;
                  lVar5 = local_48;
joined_r0x001465c9:
                  uVar13 = local_b0 + 1;
                  if (iVar18 != 0) {
                    this->tetprism_vol_sum = fc->tetprism_vol_sum + this->tetprism_vol_sum;
                    fc->tetprism_vol_sum = 0.0;
                  }
                }
                else if (((this->checksubsegflag == 0) || (local_a8.tet[8] == (tetrahedron)0x0)) ||
                        (uVar13 = local_b0, local_a8.tet[8][ver2edge[local_a8.ver]] == (double *)0x0
                        )) {
                  local_a8.ver = esymtbl[local_a8.ver];
                  lVar19 = 0x18;
                  do {
                    iVar18 = *(int *)((long)aiStack_b8 + lVar19);
                    uVar13 = *(ulong *)(*(long *)((long)aiStack_b8 + lVar19 + -8) +
                                       (long)facepivot1[iVar18] * 8);
                    uVar8 = (uint)uVar13 & 0xf;
                    *(uint *)((long)&local_a8.tet + lVar19) = uVar8;
                    *(ulong *)((long)&local_b0 + lVar19) = uVar13 & 0xfffffffffffffff0;
                    *(int *)((long)&local_a8.tet + lVar19) = facepivot2[iVar18][uVar8];
                    lVar19 = lVar19 + 0x10;
                  } while (lVar19 != 0x48);
                  if (local_78 == local_a8.tet) {
                    lStack_c0 = 0x146968;
                    flip32(this,&local_a8,0,local_58);
LAB_00146a7f:
                    iVar18 = fc->remove_ndelaunay_edge;
                    goto joined_r0x001465c9;
                  }
                  lVar19 = (long)(int)local_70;
                  local_68 = (tetrahedron *)
                             ((ulong)local_78[facepivot1[lVar19]] & 0xfffffffffffffff0);
                  local_60 = facepivot2[lVar19][(uint)local_78[facepivot1[lVar19]] & 0xf];
                  if (local_a8.tet == local_68) {
                    if ((this->nonconvex != 0) &&
                       (local_78[apexpivot[lVar19]] == (tetrahedron)this->dummypoint)) {
                      dVar20 = 0.0;
                    }
                    if ((dVar20 == 0.0) && (!NAN(dVar20))) {
                      local_a8.ver = esymtbl[local_a8.ver];
                      lStack_c0 = 0x1469ce;
                      flip23(this,&local_a8,0,local_58);
                      lVar19 = (long)(int)local_70;
                      local_98.tet = (tetrahedron *)
                                     ((ulong)local_78[facepivot1[lVar19]] & 0xfffffffffffffff0);
                      local_98.ver = facepivot2[lVar19][(uint)local_78[facepivot1[lVar19]] & 0xf];
                      local_88 = (tetrahedron *)
                                 ((ulong)local_98.tet[facepivot1[local_98.ver]] & 0xfffffffffffffff0
                                 );
                      local_80 = facepivot2[local_98.ver]
                                 [(uint)local_98.tet[facepivot1[local_98.ver]] & 0xf];
                      lStack_c0 = 0x146a6a;
                      flip32(this,&local_98,
                             (uint)(local_78[apexpivot[lVar19]] == (tetrahedron)this->dummypoint),fc
                            );
                      this->flip23count = this->flip23count + -1;
                      this->flip32count = this->flip32count + -1;
                      this->flip44count = this->flip44count + 1;
                      goto LAB_00146a7f;
                    }
                  }
                  paVar7 = this->unflipqueue;
                  lStack_c0 = 0x1466df;
                  pcVar6 = arraypool::getblock(paVar7,(int)paVar7->objects);
                  lVar14 = (long)paVar7->objectbytes *
                           ((long)paVar7->objectsperblock - 1U & paVar7->objects);
                  paVar7->objects = paVar7->objects + 1;
                  *(tetrahedron **)(pcVar6 + lVar14) = local_a8.tet;
                  *(int *)(pcVar6 + lVar14 + 8) = local_a8.ver;
                  lVar19 = (long)local_a8.ver;
                  *(tetrahedron *)(pcVar6 + lVar14 + 0x58) = local_a8.tet[orgpivot[lVar19]];
                  *(tetrahedron *)(pcVar6 + lVar14 + 0x60) = local_a8.tet[destpivot[lVar19]];
                  *(tetrahedron *)(pcVar6 + lVar14 + 0x68) = local_a8.tet[apexpivot[lVar19]];
                  uVar13 = local_b0;
                  fc = local_58;
                }
              }
            }
          }
        }
      }
      lVar14 = local_48;
      lVar19 = local_48;
      pbVar1 = *fstack;
    }
    local_48 = lVar19;
    if (0 < (long)uVar13 && 2 < this->b->verbose) {
      lStack_c0 = 0x146b1a;
      printf("      Performed %ld flips.\n");
    }
    lVar19 = local_50;
    lVar5 = lVar5 + uVar13;
    if ((this->unflipqueue->objects == 0) || (uVar13 == 0)) {
      if (2 < this->b->verbose) {
        if (0 < lVar5) {
          lStack_c0 = 0x146c11;
          printf("      Performed %ld flips.\n",lVar5);
        }
        if (0 < lVar19) {
          lStack_c0 = 0x146c27;
          printf("      Removed %ld hull slivers.\n",lVar19);
        }
        if (0 < this->unflipqueue->objects) {
          lStack_c0 = 0x146c42;
          printf("      %ld unflippable edges remained.\n");
        }
      }
      return lVar5 + lVar19;
    }
    paVar7 = this->unflipqueue;
    if (0 < paVar7->objects) {
      lVar19 = 0;
      do {
        lVar11 = (long)paVar7->objectbytes * (long)(int)(paVar7->objectsperblockmark & (uint)lVar19)
        ;
        lVar14 = *(long *)(paVar7->toparray
                           [(uint)lVar19 >> ((byte)paVar7->log2objectsperblock & 0x1f)] + lVar11);
        if ((lVar14 != 0) && (*(long *)(lVar14 + 0x20) != 0)) {
          flipface = (triface *)
                     (paVar7->toparray[(uint)lVar19 >> ((byte)paVar7->log2objectsperblock & 0x1f)] +
                     lVar11);
          iVar18 = flipface->ver;
          if ((*(long *)(lVar14 + (long)orgpivot[iVar18] * 8) == *(long *)&flipface[5].ver) &&
             ((*(tetrahedron **)(lVar14 + (long)destpivot[iVar18] * 8) == flipface[6].tet &&
              (*(long *)(lVar14 + (long)apexpivot[iVar18] * 8) == *(long *)&flipface[6].ver)))) {
            lStack_c0 = 0x146bcb;
            flippush(this,fstack,flipface);
          }
        }
        lVar19 = lVar19 + 1;
        paVar7 = this->unflipqueue;
      } while (lVar19 < paVar7->objects);
    }
    paVar7->objects = 0;
  } while( true );
}

Assistant:

long tetgenmesh::lawsonflip3d(flipconstraints *fc)
{
  triface fliptets[5], neightet, hulltet;
  face checksh, casingout;
  badface *popface, *bface;
  point pd, pe, *pts;
  REAL sign, ori;
  REAL vol, len3;
  long flipcount, totalcount = 0l;
  long sliver_peels = 0l;
  int t1ver;
  int i;


  while (1) {

    if (b->verbose > 2) {
      printf("      Lawson flip %ld faces.\n", flippool->items);
    }
    flipcount = 0l;

    while (flipstack != (badface *) NULL) {
      // Pop a face from the stack.
      popface = flipstack;
      fliptets[0] = popface->tt;
      flipstack = flipstack->nextitem; // The next top item in stack.
      flippool->dealloc((void *) popface);

      // Skip it if it is a dead tet (destroyed by previous flips).
      if (isdeadtet(fliptets[0])) continue;
      // Skip it if it is not the same tet as we saved.
      if (!facemarked(fliptets[0])) continue;

      unmarkface(fliptets[0]);

      if (ishulltet(fliptets[0])) continue;

      fsym(fliptets[0], fliptets[1]);
      if (ishulltet(fliptets[1])) {
        if (nonconvex) {
          // Check if 'fliptets[0]' it is a hull sliver.
          tspivot(fliptets[0], checksh);
          for (i = 0; i < 3; i++) {
            if (!isshsubseg(checksh)) {
              spivot(checksh, casingout);
              //assert(casingout.sh != NULL);
              if (sorg(checksh) != sdest(casingout)) sesymself(casingout);
              stpivot(casingout, neightet);
              if (neightet.tet == fliptets[0].tet) {
                // Found a hull sliver 'neightet'. Let it be [e,d,a,b], where 
                //   [e,d,a] and [d,e,b] are hull faces.
                edestoppo(neightet, hulltet); // [a,b,e,d]
                fsymself(hulltet); // [b,a,e,#]
                if (oppo(hulltet) == dummypoint) {
                  pe = org(neightet);
                  if ((pointtype(pe) == FREEFACETVERTEX) ||
                      (pointtype(pe) == FREESEGVERTEX)) {
                    removevertexbyflips(pe);
                  }
                } else {
                  eorgoppo(neightet, hulltet); // [b,a,d,e]
                  fsymself(hulltet); // [a,b,d,#]
                  if (oppo(hulltet) == dummypoint) {
                    pd = dest(neightet);
                    if ((pointtype(pd) == FREEFACETVERTEX) ||
                        (pointtype(pd) == FREESEGVERTEX)) {
                      removevertexbyflips(pd);
                    }
                  } else {
                    // Perform a 3-to-2 flip to remove the sliver.
                    fliptets[0] = neightet;          // [e,d,a,b]
                    fnext(fliptets[0], fliptets[1]); // [e,d,b,c]
                    fnext(fliptets[1], fliptets[2]); // [e,d,c,a]
                    flip32(fliptets, 1, fc);
                    // Update counters.
                    flip32count--;
                    flip22count--;
                    sliver_peels++;
                    if (fc->remove_ndelaunay_edge) {
                      // Update the volume (must be decreased).
                      //assert(fc->tetprism_vol_sum <= 0);
                      tetprism_vol_sum += fc->tetprism_vol_sum;
                      fc->tetprism_vol_sum = 0.0; // Clear it.
                    }
                  }
                }
                break;
              } // if (neightet.tet == fliptets[0].tet)
            } // if (!isshsubseg(checksh))
            senextself(checksh);
          } // i
        } // if (nonconvex)
        continue;
      }

      if (checksubfaceflag) {
        // Do not flip if it is a subface.
        if (issubface(fliptets[0])) continue;
      }

      // Test whether the face is locally Delaunay or not.
      pts = (point *) fliptets[1].tet; 
      sign = insphere_s(pts[4], pts[5], pts[6], pts[7], oppo(fliptets[0]));

      if (sign < 0) {
        // A non-Delaunay face. Try to flip it.
        pd = oppo(fliptets[0]);
        pe = oppo(fliptets[1]);

        // Use the length of the edge [d,e] as a reference to determine
        //   a nearly degenerated new tet.
        len3 = distance(pd, pe);
        len3 = (len3 * len3 * len3);

        // Check the convexity of its three edges. Stop checking either a
        //   locally non-convex edge (ori < 0) or a flat edge (ori = 0) is
        //   encountered, and 'fliptet' represents that edge.
        for (i = 0; i < 3; i++) {
          ori = orient3d(org(fliptets[0]), dest(fliptets[0]), pd, pe);
          if (ori > 0) {
            // Avoid creating a nearly degenerated new tet at boundary.
            //   Re-use fliptets[2], fliptets[3];
            esym(fliptets[0], fliptets[2]);
            esym(fliptets[1], fliptets[3]);
            if (issubface(fliptets[2]) || issubface(fliptets[3])) {
              vol = orient3dfast(org(fliptets[0]), dest(fliptets[0]), pd, pe);
              if ((fabs(vol) / len3) < b->epsilon) {
                ori = 0.0; // Do rounding.
              }
            }
          } // Rounding check
          if (ori <= 0) break;
          enextself(fliptets[0]);
          eprevself(fliptets[1]);
        }

        if (ori > 0) {
          // A 2-to-3 flip is found.
          //   [0] [a,b,c,d], 
          //   [1] [b,a,c,e]. no dummypoint.
          flip23(fliptets, 0, fc);
          flipcount++;
          if (fc->remove_ndelaunay_edge) {
            // Update the volume (must be decreased).
            //assert(fc->tetprism_vol_sum <= 0);
            tetprism_vol_sum += fc->tetprism_vol_sum;
            fc->tetprism_vol_sum = 0.0; // Clear it.
          }
          continue;
        } else { // ori <= 0
          // The edge ('fliptets[0]' = [a',b',c',d]) is non-convex or flat,
          //   where the edge [a',b'] is one of [a,b], [b,c], and [c,a].
          if (checksubsegflag) {
            // Do not flip if it is a segment.
            if (issubseg(fliptets[0])) continue;
          }
          // Check if there are three or four tets sharing at this edge.        
          esymself(fliptets[0]); // [b,a,d,c]
          for (i = 0; i < 3; i++) {
            fnext(fliptets[i], fliptets[i+1]);
          }
          if (fliptets[3].tet == fliptets[0].tet) {
            // A 3-to-2 flip is found. (No hull tet.)
            flip32(fliptets, 0, fc); 
            flipcount++;
            if (fc->remove_ndelaunay_edge) {
              // Update the volume (must be decreased).
              //assert(fc->tetprism_vol_sum <= 0);
              tetprism_vol_sum += fc->tetprism_vol_sum;
              fc->tetprism_vol_sum = 0.0; // Clear it.
            }
            continue;
          } else {
            // There are more than 3 tets at this edge.
            fnext(fliptets[3], fliptets[4]);
            if (fliptets[4].tet == fliptets[0].tet) {
              // There are exactly 4 tets at this edge.
              if (nonconvex) {
                if (apex(fliptets[3]) == dummypoint) {
                  // This edge is locally non-convex on the hull.
                  // It can be removed by a 4-to-4 flip.                  
                  ori = 0;
                }
              } // if (nonconvex)
              if (ori == 0) {
                // A 4-to-4 flip is found. (Two hull tets may be involved.)
                // Current tets in 'fliptets':
                //   [0] [b,a,d,c] (d may be newpt)
                //   [1] [b,a,c,e]
                //   [2] [b,a,e,f] (f may be dummypoint)
                //   [3] [b,a,f,d]
                esymself(fliptets[0]); // [a,b,c,d] 
                // A 2-to-3 flip replaces face [a,b,c] by edge [e,d].
                //   This creates a degenerate tet [e,d,a,b] (tmpfliptets[0]).
                //   It will be removed by the followed 3-to-2 flip.
                flip23(fliptets, 0, fc); // No hull tet.
                fnext(fliptets[3], fliptets[1]);
                fnext(fliptets[1], fliptets[2]);
                // Current tets in 'fliptets':
                //   [0] [...]
                //   [1] [b,a,d,e] (degenerated, d may be new point).
                //   [2] [b,a,e,f] (f may be dummypoint)
                //   [3] [b,a,f,d]
                // A 3-to-2 flip replaces edge [b,a] by face [d,e,f].
                //   Hull tets may be involved (f may be dummypoint).
                flip32(&(fliptets[1]), (apex(fliptets[3]) == dummypoint), fc);
                flipcount++;
                flip23count--;
                flip32count--;
                flip44count++;
                if (fc->remove_ndelaunay_edge) {
                  // Update the volume (must be decreased).
                  //assert(fc->tetprism_vol_sum <= 0);
                  tetprism_vol_sum += fc->tetprism_vol_sum;
                  fc->tetprism_vol_sum = 0.0; // Clear it.
                }
                continue;
              } // if (ori == 0)
            }
          }
        } // if (ori <= 0)

        // This non-Delaunay face is unflippable. Save it.
        unflipqueue->newindex((void **) &bface);
        bface->tt = fliptets[0];
        bface->forg  = org(fliptets[0]);
        bface->fdest = dest(fliptets[0]);
        bface->fapex = apex(fliptets[0]);
      } // if (sign < 0)
    } // while (flipstack)

    if (b->verbose > 2) {
      if (flipcount > 0) {
        printf("      Performed %ld flips.\n", flipcount);
      }
    }
    // Accumulate the counter of flips.
    totalcount += flipcount;

    // Return if no unflippable faces left.
    if (unflipqueue->objects == 0l) break; 
    // Return if no flip has been performed.
    if (flipcount == 0l) break;

    // Try to flip the unflippable faces.
    for (i = 0; i < unflipqueue->objects; i++) {
      bface = (badface *) fastlookup(unflipqueue, i);
      if (!isdeadtet(bface->tt) && 
          (org(bface->tt) == bface->forg) &&
          (dest(bface->tt) == bface->fdest) &&
          (apex(bface->tt) == bface->fapex)) {
        flippush(flipstack, &(bface->tt));
      }
    }
    unflipqueue->restart();

  } // while (1)

  if (b->verbose > 2) {
    if (totalcount > 0) {
      printf("      Performed %ld flips.\n", totalcount);
    }
    if (sliver_peels > 0) {
      printf("      Removed %ld hull slivers.\n", sliver_peels);
    }
    if (unflipqueue->objects > 0l) {
      printf("      %ld unflippable edges remained.\n", unflipqueue->objects);
    }
  }

  return totalcount + sliver_peels;
}